

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * unpack30_32(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0x3fffffff) + base;
  uVar1 = *in;
  out[1] = uVar1 >> 0x1e;
  out[1] = (uVar1 >> 0x1e) + base + (in[1] & 0xfffffff) * 4;
  uVar1 = in[1];
  out[2] = uVar1 >> 0x1c;
  out[2] = (uVar1 >> 0x1c) + base + (in[2] & 0x3ffffff) * 0x10;
  uVar1 = in[2];
  out[3] = uVar1 >> 0x1a;
  out[3] = (uVar1 >> 0x1a) + base + (in[3] & 0xffffff) * 0x40;
  uVar1 = in[3];
  out[4] = uVar1 >> 0x18;
  out[4] = (uVar1 >> 0x18) + base + (in[4] & 0x3fffff) * 0x100;
  uVar1 = in[4];
  out[5] = uVar1 >> 0x16;
  out[5] = (uVar1 >> 0x16) + base + (in[5] & 0xfffff) * 0x400;
  uVar1 = in[5];
  out[6] = uVar1 >> 0x14;
  out[6] = (uVar1 >> 0x14) + base + (in[6] & 0x3ffff) * 0x1000;
  uVar1 = in[6];
  out[7] = uVar1 >> 0x12;
  out[7] = (uVar1 >> 0x12) + base + (in[7] & 0xffff) * 0x4000;
  uVar1 = in[7];
  out[8] = uVar1 >> 0x10;
  out[8] = (uVar1 >> 0x10) + base + (in[8] & 0x3fff) * 0x10000;
  uVar1 = in[8];
  out[9] = uVar1 >> 0xe;
  out[9] = (uVar1 >> 0xe) + base + (in[9] & 0xfff) * 0x40000;
  uVar1 = in[9];
  out[10] = uVar1 >> 0xc;
  out[10] = (uVar1 >> 0xc) + base + (in[10] & 0x3ff) * 0x100000;
  uVar1 = in[10];
  out[0xb] = uVar1 >> 10;
  out[0xb] = (uVar1 >> 10) + base + (in[0xb] & 0xff) * 0x400000;
  uVar1 = in[0xb];
  out[0xc] = uVar1 >> 8;
  out[0xc] = (uVar1 >> 8) + base + (in[0xc] & 0x3f) * 0x1000000;
  uVar1 = in[0xc];
  out[0xd] = uVar1 >> 6;
  out[0xd] = (uVar1 >> 6) + base + (in[0xd] & 0xf) * 0x4000000;
  uVar1 = in[0xd];
  out[0xe] = uVar1 >> 4;
  out[0xe] = (uVar1 >> 4) + base + (in[0xe] & 3) * 0x10000000;
  out[0xf] = (in[0xe] >> 2) + base;
  out[0x10] = (in[0xf] & 0x3fffffff) + base;
  uVar1 = in[0xf];
  out[0x11] = uVar1 >> 0x1e;
  out[0x11] = (uVar1 >> 0x1e) + base + (in[0x10] & 0xfffffff) * 4;
  uVar1 = in[0x10];
  out[0x12] = uVar1 >> 0x1c;
  out[0x12] = (uVar1 >> 0x1c) + base + (in[0x11] & 0x3ffffff) * 0x10;
  uVar1 = in[0x11];
  out[0x13] = uVar1 >> 0x1a;
  out[0x13] = (uVar1 >> 0x1a) + base + (in[0x12] & 0xffffff) * 0x40;
  uVar1 = in[0x12];
  out[0x14] = uVar1 >> 0x18;
  out[0x14] = (uVar1 >> 0x18) + base + (in[0x13] & 0x3fffff) * 0x100;
  uVar1 = in[0x13];
  out[0x15] = uVar1 >> 0x16;
  out[0x15] = (uVar1 >> 0x16) + base + (in[0x14] & 0xfffff) * 0x400;
  uVar1 = in[0x14];
  out[0x16] = uVar1 >> 0x14;
  out[0x16] = (uVar1 >> 0x14) + base + (in[0x15] & 0x3ffff) * 0x1000;
  uVar1 = in[0x15];
  out[0x17] = uVar1 >> 0x12;
  out[0x17] = (uVar1 >> 0x12) + base + (in[0x16] & 0xffff) * 0x4000;
  uVar1 = in[0x16];
  out[0x18] = uVar1 >> 0x10;
  out[0x18] = (uVar1 >> 0x10) + base + (in[0x17] & 0x3fff) * 0x10000;
  uVar1 = in[0x17];
  out[0x19] = uVar1 >> 0xe;
  out[0x19] = (uVar1 >> 0xe) + base + (in[0x18] & 0xfff) * 0x40000;
  uVar1 = in[0x18];
  out[0x1a] = uVar1 >> 0xc;
  out[0x1a] = (uVar1 >> 0xc) + base + (in[0x19] & 0x3ff) * 0x100000;
  uVar1 = in[0x19];
  out[0x1b] = uVar1 >> 10;
  out[0x1b] = (uVar1 >> 10) + base + (in[0x1a] & 0xff) * 0x400000;
  uVar1 = in[0x1a];
  out[0x1c] = uVar1 >> 8;
  out[0x1c] = (uVar1 >> 8) + base + (in[0x1b] & 0x3f) * 0x1000000;
  uVar1 = in[0x1b];
  out[0x1d] = uVar1 >> 6;
  out[0x1d] = (uVar1 >> 6) + base + (in[0x1c] & 0xf) * 0x4000000;
  uVar1 = in[0x1c];
  out[0x1e] = uVar1 >> 4;
  out[0x1e] = (uVar1 >> 4) + base + (in[0x1d] & 3) * 0x10000000;
  out[0x1f] = (in[0x1d] >> 2) + base;
  return in + 0x1e;
}

Assistant:

uint32_t * unpack30_32( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 30 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 28 ))<<( 30 - 28 );
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 26 ))<<( 30 - 26 );
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 24 ))<<( 30 - 24 );
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 22 ))<<( 30 - 22 );
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 30 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 18 ))<<( 30 - 18 );
    *out += base;
    out++;
    *out = ( (*in) >>  18  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 30 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 14 ))<<( 30 - 14 );
    *out += base;
    out++;
    *out = ( (*in) >>  14  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 30 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out |= ((*in) % (1U<< 10 ))<<( 30 - 10 );
    *out += base;
    out++;
    *out = ( (*in) >>  10  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 30 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  ) ;
    ++in;
    *out |= ((*in) % (1U<< 6 ))<<( 30 - 6 );
    *out += base;
    out++;
    *out = ( (*in) >>  6  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 30 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  ) ;
    ++in;
    *out |= ((*in) % (1U<< 2 ))<<( 30 - 2 );
    *out += base;
    out++;
    *out = ( (*in) >>  2  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 30 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 28 ))<<( 30 - 28 );
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 26 ))<<( 30 - 26 );
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 24 ))<<( 30 - 24 );
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 22 ))<<( 30 - 22 );
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 30 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 18 ))<<( 30 - 18 );
    *out += base;
    out++;
    *out = ( (*in) >>  18  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 30 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 14 ))<<( 30 - 14 );
    *out += base;
    out++;
    *out = ( (*in) >>  14  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 30 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out |= ((*in) % (1U<< 10 ))<<( 30 - 10 );
    *out += base;
    out++;
    *out = ( (*in) >>  10  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 30 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  ) ;
    ++in;
    *out |= ((*in) % (1U<< 6 ))<<( 30 - 6 );
    *out += base;
    out++;
    *out = ( (*in) >>  6  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 30 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  ) ;
    ++in;
    *out |= ((*in) % (1U<< 2 ))<<( 30 - 2 );
    *out += base;
    out++;
    *out = ( (*in) >>  2  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}